

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_std_suite.cpp
# Opt level: O0

void compact_array_suite::test_uint32(void)

{
  iterator iVar1;
  iterator iVar2;
  undefined8 uStack_f8;
  output_type expected [18];
  undefined1 auStack_d8 [8];
  array<unsigned_int,_4UL> value;
  undefined1 local_b8 [8];
  oarchive ar;
  undefined1 local_20 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  trial::protocol::bintoken::oarchive::
  oarchive<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((oarchive *)local_b8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20)
  ;
  auStack_d8._0_4_ = 0;
  auStack_d8._4_4_ = 1;
  value._M_elems[0] = 0;
  value._M_elems[1] = 0xffffffff;
  boost::archive::detail::interface_oarchive<trial::protocol::bintoken::oarchive>::operator<<
            ((interface_oarchive<trial::protocol::bintoken::oarchive> *)local_b8,
             (array<unsigned_int,_4UL> *)auStack_d8);
  uStack_f8 = 0x10000000010ac;
  expected[0] = '\0';
  expected[1] = '\0';
  expected[2] = '\0';
  expected[3] = '\0';
  expected[4] = '\0';
  expected[5] = '\0';
  expected[6] = 0xff;
  expected[7] = 0xff;
  expected[8] = 0xff;
  expected[9] = 0xff;
  iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/oarchive_std_suite.cpp"
             ,0xa7,"void compact_array_suite::test_uint32()",iVar1._M_current,iVar2._M_current,
             &uStack_f8,expected + 10);
  trial::protocol::bintoken::oarchive::~oarchive((oarchive *)local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  return;
}

Assistant:

void test_uint32()
{
    std::vector<output_type> result;
    format::oarchive ar(result);
    std::array<std::uint32_t, 4> value = {{0, 1, std::numeric_limits<std::uint32_t>::min(), std::numeric_limits<std::uint32_t>::max()}};
    ar << value;

    output_type expected[] = { token::code::array8_int32, 4 * token::int32::size,
                               0x00, 0x00, 0x00, 0x00,
                               0x01, 0x00, 0x00, 0x00,
                               0x00, 0x00, 0x00, 0x00,
                               0xFF, 0xFF, 0xFF, 0xFF };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<output_type>());
}